

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_ruleparser.h
# Opt level: O1

void __thiscall BamTools::RuleParser::parse(RuleParser *this)

{
  queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  stack<BamTools::RuleToken,_std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>_>
  *this_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  _Elt_pointer pRVar5;
  uint uVar6;
  RuleToken token;
  RuleToken local_58;
  
  this_00 = &this->m_ruleQueue;
  if ((this->m_ruleQueue).c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->m_ruleQueue).c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_front(&this_00->c);
    } while ((this->m_ruleQueue).c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             (this->m_ruleQueue).c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  if ((this->m_ruleString)._M_string_length != 0) {
    this->m_current = this->m_begin;
    local_58.Value._M_dataplus._M_p = (pointer)&local_58.Value.field_2;
    local_58.Value._M_string_length = 0;
    local_58.Value.field_2._M_local_buf[0] = '\0';
    this_01 = &this->m_operatorStack;
    while (bVar1 = readToken(this,&local_58), bVar1 && local_58.Value._M_string_length != 0) {
      if (local_58.Type == OPERAND) {
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this_00->c,&local_58.Value);
      }
      else if (local_58.Type < LEFT_PARENTHESIS) {
        while (pRVar5 = (this->m_operatorStack).c.
                        super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur,
              pRVar5 != (this->m_operatorStack).c.
                        super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          if (pRVar5 == (this->m_operatorStack).c.
                        super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pRVar5 = (this->m_operatorStack).c.
                     super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>.
                     _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
          }
          if (local_58.Type - RIGHT_PARENTHESIS < 0xfffffffe) {
            iVar2 = -1;
            iVar3 = -1;
            if (local_58.Type - AND_OPERATOR < 5) {
              iVar3 = *(int *)(&DAT_001c36bc + (ulong)(local_58.Type - AND_OPERATOR) * 4);
            }
            uVar6 = pRVar5[-1].Type - AND_OPERATOR;
            if (uVar6 < 5) {
              iVar2 = *(int *)(&DAT_001c36bc + (ulong)uVar6 * 4);
            }
            if (iVar2 < iVar3) goto LAB_00160c79;
          }
          else {
LAB_00160c79:
            if (1 < local_58.Type - NOT_OPERATOR) break;
            iVar2 = -1;
            iVar3 = -1;
            if (local_58.Type - AND_OPERATOR < 5) {
              iVar3 = *(int *)(&DAT_001c36bc + (ulong)(local_58.Type - AND_OPERATOR) * 4);
            }
            uVar6 = pRVar5[-1].Type - AND_OPERATOR;
            if (uVar6 < 5) {
              iVar2 = *(int *)(&DAT_001c36bc + (ulong)uVar6 * 4);
            }
            if (iVar2 <= iVar3) break;
          }
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this_00->c,&pRVar5[-1].Value);
          std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>::pop_back
                    (&this_01->c);
        }
LAB_00160d62:
        std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>::push_back
                  (&this_01->c,&local_58);
      }
      else {
        if (local_58.Type == LEFT_PARENTHESIS) goto LAB_00160d62;
        if ((local_58.Type == RIGHT_PARENTHESIS) &&
           (pRVar5 = (this->m_operatorStack).c.
                     super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>.
                     _M_impl.super__Deque_impl_data._M_finish._M_cur,
           pRVar5 != (this->m_operatorStack).c.
                     super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_cur)) {
          bVar1 = false;
          do {
            if (pRVar5 == (this->m_operatorStack).c.
                          super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              pRVar5 = (this->m_operatorStack).c.
                       super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>.
                       _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
            }
            bVar4 = true;
            if (pRVar5[-1].Type != LEFT_PARENTHESIS) {
              std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&this_00->c,&pRVar5[-1].Value);
              bVar4 = bVar1;
            }
            std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>::pop_back
                      (&this_01->c);
            pRVar5 = (this->m_operatorStack).c.
                     super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>.
                     _M_impl.super__Deque_impl_data._M_finish._M_cur;
          } while ((pRVar5 != (this->m_operatorStack).c.
                              super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_cur) &&
                  (bVar1 = bVar4, !bVar4));
        }
      }
    }
    pRVar5 = (this->m_operatorStack).c.
             super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pRVar5 != (this->m_operatorStack).c.
                  super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur) {
      do {
        if (pRVar5 == (this->m_operatorStack).c.
                      super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>.
                      _M_impl.super__Deque_impl_data._M_finish._M_first) {
          pRVar5 = (this->m_operatorStack).c.
                   super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
        }
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this_00->c,&pRVar5[-1].Value);
        std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>::pop_back(&this_01->c)
        ;
        pRVar5 = (this->m_operatorStack).c.
                 super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
      } while (pRVar5 != (this->m_operatorStack).c.
                         super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.Value._M_dataplus._M_p != &local_58.Value.field_2) {
      operator_delete(local_58.Value._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

inline void RuleParser::parse()
{

    // clear out any prior data
    while (!m_ruleQueue.empty())
        m_ruleQueue.pop();

    // skip if no rule to parse
    if (m_ruleString.empty()) return;

    // start at beginning of ruleString
    m_current = m_begin;

    // iterate through tokens in rule string
    RuleToken token;
    while (readToken(token)) {

        if (token.Value.empty()) break;

        // if token is an operand
        if (isOperand(token)) m_ruleQueue.push(token.Value);

        // if token is an operator
        else if (isOperator(token)) {

            // pop any operators at top of stack with higher priority
            while (!m_operatorStack.empty()) {
                const RuleToken& opToken = m_operatorStack.top();
                if ((isLeftAssociative(token) && (priority(token) <= priority(opToken))) ||
                    (isRightAssociative(token) && (priority(token) < priority(opToken)))) {
                    m_ruleQueue.push(opToken.Value);
                    m_operatorStack.pop();
                } else
                    break;
            }

            // push current operator token onto stack
            m_operatorStack.push(token);
        }

        // if token is left parenthesis
        else if (isLeftParenthesis(token))
            m_operatorStack.push(token);

        // if token is right parenthesis
        else if (isRightParenthesis(token)) {

            bool foundLeftParenthesis = false;

            // push operators into rule queue until left parenthesis found
            while (!m_operatorStack.empty() && !foundLeftParenthesis) {
                const RuleToken& opToken = m_operatorStack.top();
                if (!isLeftParenthesis(opToken))
                    m_ruleQueue.push(opToken.Value);
                else
                    foundLeftParenthesis = true;
                m_operatorStack.pop();
            }

            // no left parenthesis found, error
            BAMTOOLS_ASSERT_MESSAGE(foundLeftParenthesis,
                                    "ERROR: Mismatched parenthesis in rule string.1");
        }

        // error: unknown operand
        else
            BAMTOOLS_ASSERT_UNREACHABLE;
    }

    // while there are still operators on stack
    while (!m_operatorStack.empty()) {
        const RuleToken& token = m_operatorStack.top();
        BAMTOOLS_ASSERT_MESSAGE((!isLeftParenthesis(token) && !isRightParenthesis(token)),
                                "ERROR: Mismatched parenthesis in rule string.2");
        m_ruleQueue.push(token.Value);
        m_operatorStack.pop();
    }
}